

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O0

uint8_t * google::protobuf::internal::PrimitiveTypeHelper<17>::SerializeToArray
                    (void *ptr,uint8_t *buffer)

{
  int *piVar1;
  uint8_t *puVar2;
  uint8_t *buffer_local;
  void *ptr_local;
  
  piVar1 = Get<int>(ptr);
  puVar2 = WireFormatLite::WriteSInt32NoTagToArray(*piVar1,buffer);
  return puVar2;
}

Assistant:

static uint8_t* SerializeToArray(const void* ptr, uint8_t* buffer) {
    return WireFormatLite::WriteSInt32NoTagToArray(Get<Type>(ptr), buffer);
  }